

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::TfDeleteActiveTest::iterate(TfDeleteActiveTest *this)

{
  CallLogWrapper *this_00;
  RenderContext *renderCtx;
  GLenum GVar1;
  ProgramSources *pPVar2;
  TestError *this_01;
  char *description;
  GLuint tf;
  allocator<char> local_2ab;
  allocator<char> local_2aa;
  allocator<char> local_2a9;
  Buffer buf;
  string local_290 [32];
  value_type local_270;
  string local_250;
  string local_230;
  undefined1 local_210 [40];
  undefined1 local_1e8 [40];
  ScopedTransformFeedbackFeedback xfb;
  ShaderProgram program;
  
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&buf,((this->super_TestCase).m_context)->m_renderCtx);
  tf = 0;
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&xfb,0,0xac);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,
             "#version 300 es\nvoid main ()\n{\n\tgl_Position = vec4(float(gl_VertexID) / 2.0, float(gl_VertexID % 2) / 2.0, 0.0, 1.0);\n}\n"
             ,&local_2a9);
  glu::VertexSource::VertexSource((VertexSource *)local_210,&local_230);
  pPVar2 = glu::ProgramSources::operator<<((ProgramSources *)&xfb,(ShaderSource *)local_210);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,
             "#version 300 es\nlayout(location=0) out mediump vec4 dEQP_FragColor;\nvoid main ()\n{\n\tdEQP_FragColor = vec4(1.0, 1.0, 0.0, 1.0);\n}\n"
             ,&local_2aa);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_1e8,&local_250);
  pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_1e8);
  pPVar2->transformFeedbackBufferMode = 0x8c8c;
  std::__cxx11::string::string<std::allocator<char>>(local_290,"gl_Position",&local_2ab);
  std::__cxx11::string::string((string *)&local_270,local_290);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&pPVar2->transformFeedbackVaryings,&local_270);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,pPVar2);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string((string *)(local_1e8 + 8));
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)(local_210 + 8));
  std::__cxx11::string::~string((string *)&local_230);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&xfb);
  if (program.m_program.m_info.linkOk != false) {
    this_00 = &this->super_CallLogWrapper;
    glu::CallLogWrapper::glUseProgram(this_00,program.m_program.m_program);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar1,"glUseProgram(program.getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                    ,0x208);
    glu::CallLogWrapper::glGenTransformFeedbacks(this_00,1,&tf);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar1,"glGenTransformFeedbacks(1, &tf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                    ,0x209);
    glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,tf);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar1,"glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, tf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                    ,0x20a);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,buf.super_ObjectWrapper.m_object);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar1,"glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, *buf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                    ,0x20b);
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,0x30,(void *)0x0,0x88ea);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar1,
                    "glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 3 * sizeof(glw::GLfloat[4]), DE_NULL, GL_DYNAMIC_COPY)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                    ,0x20c);
    xfb.m_gl = this_00;
    glu::CallLogWrapper::glBeginTransformFeedback(this_00,4);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar1,"glBeginTransformFeedback",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                    ,0x1e1);
    glu::CallLogWrapper::glDeleteTransformFeedbacks(this_00,1,&tf);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    description = "Pass";
    if (GVar1 != 0x502) {
      description = "Deleting active transform feedback did not produce GL_INVALID_OPERATION";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(GVar1 != 0x502)
               ,description);
    ScopedTransformFeedbackFeedback::~ScopedTransformFeedbackFeedback(&xfb);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar1,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                    ,0x21c);
    glu::CallLogWrapper::glDeleteTransformFeedbacks(this_00,1,&tf);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar1,"glDeleteTransformFeedbacks(1, &tf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                    ,0x21e);
    glu::ShaderProgram::~ShaderProgram(&program);
    glu::ObjectWrapper::~ObjectWrapper(&buf.super_ObjectWrapper);
    return STOP;
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&xfb,"failed to build program",(allocator<char> *)local_210);
  tcu::TestError::TestError(this_01,(string *)&xfb);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult TfDeleteActiveTest::iterate (void)
{
	static const char* const s_xfbVertexSource =	"#version 300 es\n"
													"void main ()\n"
													"{\n"
													"	gl_Position = vec4(float(gl_VertexID) / 2.0, float(gl_VertexID % 2) / 2.0, 0.0, 1.0);\n"
													"}\n";
	static const char* const s_xfbFragmentSource =	"#version 300 es\n"
													"layout(location=0) out mediump vec4 dEQP_FragColor;\n"
													"void main ()\n"
													"{\n"
													"	dEQP_FragColor = vec4(1.0, 1.0, 0.0, 1.0);\n"
													"}\n";

	glu::Buffer			buf			(m_context.getRenderContext());
	GLuint				tf			= 0;
	glu::ShaderProgram	program		(m_context.getRenderContext(),
									 glu::ProgramSources()
										<< glu::VertexSource(s_xfbVertexSource)
										<< glu::FragmentSource(s_xfbFragmentSource)
										<< glu::TransformFeedbackMode(GL_INTERLEAVED_ATTRIBS)
										<< glu::TransformFeedbackVarying("gl_Position"));

	if (!program.isOk())
	{
		m_testCtx.getLog() << program;
		throw tcu::TestError("failed to build program");
	}

	try
	{
		GLU_CHECK_CALL(glUseProgram(program.getProgram()));
		GLU_CHECK_CALL(glGenTransformFeedbacks(1, &tf));
		GLU_CHECK_CALL(glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, tf));
		GLU_CHECK_CALL(glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, *buf));
		GLU_CHECK_CALL(glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 3 * sizeof(glw::GLfloat[4]), DE_NULL, GL_DYNAMIC_COPY));

		{
			ScopedTransformFeedbackFeedback xfb(static_cast<glu::CallLogWrapper&>(*this), GL_TRIANGLES);

			glDeleteTransformFeedbacks(1, &tf);
			{
				GLenum err = glGetError();
				if (err != GL_INVALID_OPERATION)
					getTestContext().setTestResult(
						QP_TEST_RESULT_FAIL,
						"Deleting active transform feedback did not produce GL_INVALID_OPERATION");
				else
					getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
			}
		}
		GLU_CHECK(); // ScopedTransformFeedbackFeedback::dtor might modify error state

		GLU_CHECK_CALL(glDeleteTransformFeedbacks(1, &tf));
	}
	catch (const glu::Error&)
	{
		glDeleteTransformFeedbacks(1, &tf);
		throw;
	}

	return STOP;
}